

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

void __thiscall
mjs::conditional_expression::conditional_expression
          (conditional_expression *this,source_extend *extend,expression_ptr *cond,
          expression_ptr *lhs,expression_ptr *rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  uint32_t uVar2;
  
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__syntax_node_001da118;
  (this->super_expression).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->super_expression).super_syntax_node.extend_.file.
  super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  uVar2 = extend->end;
  (this->super_expression).super_syntax_node.extend_.start = extend->start;
  (this->super_expression).super_syntax_node.extend_.end = uVar2;
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__conditional_expression_001da1d0;
  (this->cond_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (cond->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (cond->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  (this->lhs_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (lhs->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (lhs->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  (this->rhs_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl =
       (rhs->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  (rhs->_M_t).super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
  super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
  super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl = (expression *)0x0;
  if ((this->lhs_)._M_t.
      super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
      super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl != (expression *)0x0) {
    if ((this->rhs_)._M_t.
        super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
        super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
        super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl != (expression *)0x0) {
      return;
    }
    __assert_fail("rhs_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x19c,
                  "mjs::conditional_expression::conditional_expression(const source_extend &, expression_ptr &&, expression_ptr &&, expression_ptr &&)"
                 );
  }
  __assert_fail("lhs_",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                0x19b,
                "mjs::conditional_expression::conditional_expression(const source_extend &, expression_ptr &&, expression_ptr &&, expression_ptr &&)"
               );
}

Assistant:

explicit conditional_expression(const source_extend& extend, expression_ptr&& cond, expression_ptr&& lhs, expression_ptr&& rhs) : expression(extend), cond_(std::move(cond)), lhs_(std::move(lhs)), rhs_(std::move(rhs)) {
        assert(lhs_);
        assert(rhs_);
    }